

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

string * __thiscall
lf::base::Timer::Format_abi_cxx11_(string *__return_storage_ptr__,Timer *this,string_view format)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  rep rVar1;
  rep rVar2;
  size_t extraout_RDX;
  nanoseconds *this_00;
  nanoseconds *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  args_3;
  string_view fmt;
  string_view s_00;
  format_args args;
  named_arg<char,_double> local_258;
  named_arg<char,_double> local_248;
  double local_238;
  named_arg<char,_double> local_230;
  double local_220;
  named_arg<char,_double> local_218;
  named_arg<char,_double> local_208;
  Timer *local_1f8;
  size_t sStack_1f0;
  basic_string_view<char> local_1e0;
  basic_string_view<char> local_1d0;
  basic_format_string<char,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>_>
  local_1c0;
  double local_1b0;
  double percent;
  double total_sec;
  rep total;
  double wall_sec;
  double sec;
  Timer *this_local;
  string_view format_local;
  arg_data<fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>,_char,_5UL,_5UL>
  local_168;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_90;
  named_arg<char,_double> *local_88;
  named_arg<char,_double> *local_80;
  named_arg<char,_double> *local_78;
  named_arg<char,_double> *local_70;
  v10 *local_68;
  char *pcStack_60;
  string *local_58;
  v10 **local_50;
  arg_data<fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>,_char,_5UL,_5UL>
  *local_30;
  undefined1 *local_28;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  format_local._M_len = (size_t)format._M_str;
  this_local = (Timer *)format._M_len;
  wall_sec = 1000000000.0;
  sec = (double)this;
  format_local._M_str = (char *)__return_storage_ptr__;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)this);
  total = (rep)((double)rVar1 / 1000000000.0);
  this_00 = &(this->times_).system;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(this_00);
  this_01 = &(this->times_).user;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(this_01);
  total_sec = (double)(rVar1 + rVar2);
  percent = (double)(long)total_sec / 1000000000.0;
  local_1b0 = (percent / (double)total) * 100.0;
  local_1f8 = this_local;
  sStack_1f0 = format_local._M_len;
  s._M_str = (char *)format_local._M_len;
  s._M_len = (size_t)this_local;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>(&local_1e0,s);
  s_00.size_ = extraout_RDX;
  s_00.data_ = (char *)local_1e0.size_;
  local_1d0 = (basic_string_view<char>)::fmt::v10::runtime((v10 *)local_1e0.data_,s_00);
  ::fmt::v10::
  basic_format_string<char,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>_>
  ::basic_format_string(&local_1c0,(runtime_format_string<char>)local_1d0);
  local_208 = ::fmt::v10::arg<char,double>("w",(double *)&total);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(this_01);
  local_220 = (double)rVar1 / 1000000000.0;
  local_218 = ::fmt::v10::arg<char,double>("u",&local_220);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(this_00);
  local_238 = (double)rVar1 / 1000000000.0;
  local_230 = ::fmt::v10::arg<char,double>("s",&local_238);
  local_248 = ::fmt::v10::arg<char,double>("t",&percent);
  local_258 = ::fmt::v10::arg<char,double>("p",&local_1b0);
  local_68 = (v10 *)local_1c0.str_.data_;
  pcStack_60 = (char *)local_1c0.str_.size_;
  local_70 = &local_208;
  local_78 = &local_218;
  local_80 = &local_230;
  local_88 = &local_248;
  args_3.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_258;
  local_50 = &local_68;
  local_a0 = (v10 *)local_1c0.str_.data_;
  local_98 = (char *)local_1c0.str_.size_;
  local_90.values_ = args_3.values_;
  local_58 = __return_storage_ptr__;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::detail::named_arg<char,double>,fmt::v10::detail::named_arg<char,double>,fmt::v10::detail::named_arg<char,double>,fmt::v10::detail::named_arg<char,double>,fmt::v10::detail::named_arg<char,double>>
            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>,_fmt::v10::detail::named_arg<char,_double>_>
              *)&local_168,(v10 *)local_70,local_78,local_80,local_88,
             (named_arg<char,_double> *)args_3.values_,(named_arg<char,_double> *)this);
  local_30 = &local_168;
  local_28 = local_b0;
  local_20 = ::fmt::v10::detail::
             arg_data<fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>,_char,_5UL,_5UL>
             ::args(local_30);
  local_18 = 0x40000000000aaaaa;
  fmt.size_ = 0x40000000000aaaaa;
  fmt.data_ = local_98;
  args.field_1.values_ = args_3.values_;
  args.desc_ = (unsigned_long_long)local_20;
  local_10 = local_b0;
  ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,local_a0,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string Timer::Format(std::string_view format) const {
  const double sec = 1000000000.0L;
  const double wall_sec = static_cast<double>(times_.wall.count()) / sec;
  const auto total = times_.system.count() + times_.user.count();
  const double total_sec = static_cast<double>(total) / sec;
  const double percent = (total_sec / wall_sec) * 100.0;

  return fmt::format(
      fmt::runtime(format), fmt::arg("w", wall_sec),
      fmt::arg("u", static_cast<double>(times_.user.count()) / sec),
      fmt::arg("s", static_cast<double>(times_.system.count()) / sec),
      fmt::arg("t", total_sec), fmt::arg("p", percent));
}